

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sys_error.cc
# Opt level: O0

char * __thiscall ixxx::sys_error::what(sys_error *this)

{
  int __errnum;
  bool bVar1;
  char *pcVar2;
  ostream *poVar3;
  reference pvVar4;
  pointer __buf;
  size_type __buflen;
  pointer __p;
  undefined1 local_290 [8];
  array<char,_256UL> buffer;
  char *errno_s;
  ostringstream o;
  sys_error *this_local;
  
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->what_);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&errno_s);
    pcVar2 = (char *)(**(code **)(*(long *)this + 0x20))();
    poVar3 = std::operator<<((ostream *)&errno_s,pcVar2);
    std::operator<<(poVar3,": ");
    if (this->errno_ != 0) {
      buffer._M_elems[0xf8] = '\0';
      buffer._M_elems[0xf9] = '\0';
      buffer._M_elems[0xfa] = '\0';
      buffer._M_elems[0xfb] = '\0';
      buffer._M_elems[0xfc] = '\0';
      buffer._M_elems[0xfd] = '\0';
      buffer._M_elems[0xfe] = '\0';
      buffer._M_elems[0xff] = '\0';
      if (this->type_ == 0) {
        buffer._M_elems._248_8_ = std::array<char,_256UL>::data((array<char,_256UL> *)local_290);
        pvVar4 = std::array<char,_256UL>::operator[]((array<char,_256UL> *)local_290,0);
        *pvVar4 = '\0';
        __errnum = this->errno_;
        __buf = std::array<char,_256UL>::data((array<char,_256UL> *)local_290);
        __buflen = std::array<char,_256UL>::size((array<char,_256UL> *)local_290);
        buffer._M_elems._248_8_ = strerror_r(__errnum,__buf,__buflen);
      }
      else if (this->type_ == 1) {
        buffer._M_elems._248_8_ = gai_strerror(this->errno_);
      }
      poVar3 = std::operator<<((ostream *)&errno_s,(char *)buffer._M_elems._248_8_);
      poVar3 = std::operator<<(poVar3," (");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->errno_);
      std::operator<<(poVar3,')');
    }
    if (this->literal_ != (char *)0x0) {
      if (this->errno_ != 0) {
        std::operator<<((ostream *)&errno_s," - ");
      }
      std::operator<<((ostream *)&errno_s,this->literal_);
    }
    __p = (pointer)operator_new(0x20);
    std::__cxx11::ostringstream::str();
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::reset(&this->what_,__p);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&errno_s);
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator->(&this->what_);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  return pcVar2;
}

Assistant:

const char* sys_error::what() const noexcept
    {
        if (!what_) {
            std::ostringstream o;
            o << name() << ": ";
            if (errno_) {
                const char* errno_s = nullptr;
                switch (type_) {
                    case ERRNO:
                        {
                            std::array<char, 256> buffer;
                            errno_s = buffer.data();
                            buffer[0] = 0;
                            // g++ unconditionally defines _GNU_SOURCE
                            // https://bugs.debian.org/cgi-bin/bugreport.cgi?bug=485135
                            // http://stackoverflow.com/questions/11670581/why-is-gnu-source-defined-by-default-and-how-to-turn-it-off
#ifdef _GNU_SOURCE
                            // this API makes more sense as it avoids a copy in the good case
                            errno_s = ::strerror_r(errno_, buffer.data(), buffer.size());
#else
#if defined(__MINGW32__) || defined(__MINGW64__)
                            // cf. sec_api/string_s.h
                            int r = strerror_s(buffer.data(), buffer.size(), errno_);
#else
                            int r = ::strerror_r(errno_, buffer.data(), buffer.size());
#endif
                            if (r)
                                buffer[buffer.size()-1] = 0;
#endif
                        }
                        break;
                    case GAI:
                        errno_s = gai_strerror(errno_);
                        break;
                }
                o << errno_s << " (" << errno_ << ')';
            }
            if (literal_) {
                if (errno_)
                    o << " - ";
                o << literal_;
            }
            what_.reset(new std::string(o.str()));
        }
        return what_->c_str();
    }